

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_int>
          (uintwide_t<512U,_unsigned_int,_void,_false> *this,uint n)

{
  uint uVar1;
  sbyte sVar2;
  long lVar3;
  ulong __n;
  uint uVar4;
  uint uVar5;
  
  uVar4 = 0x10;
  if (n >> 5 < 0x10) {
    uVar4 = n >> 5;
  }
  if (0x1f < n) {
    __n = (ulong)(uVar4 * 4);
    if (n < 0x200) {
      lVar3 = -0x40;
      do {
        *(undefined4 *)((long)this[1].values.super_array<unsigned_int,_16UL>.elems + lVar3) =
             *(undefined4 *)
              ((long)this[1].values.super_array<unsigned_int,_16UL>.elems + lVar3 + __n);
        lVar3 = lVar3 + 4;
      } while (__n + lVar3 != 0);
    }
    memset((void *)((long)this + (0x40 - __n)),0,__n);
  }
  if (n < 0x200 && (n & 0x1f) != 0) {
    sVar2 = (sbyte)(n & 0x1f);
    lVar3 = -(ulong)(uVar4 << 2);
    uVar4 = 0;
    do {
      uVar1 = *(uint *)((long)(this->values).super_array<unsigned_int,_16UL>.elems + lVar3 + 0x3c);
      uVar5 = uVar1 >> sVar2 | uVar4;
      uVar4 = uVar1 << (0x20U - sVar2 & 0x1f);
      *(uint *)((long)(this->values).super_array<unsigned_int,_16UL>.elems + lVar3 + 0x3c) = uVar5;
      lVar3 = lVar3 + -4;
    } while (lVar3 != -0x40);
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }